

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.h
# Opt level: O3

double __thiscall
mp::internal::BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector>::
VisitBinary(BasicRandomAffineExprExtractor<mp::(anonymous_namespace)::VariableCollector> *this,
           BinaryExpr e)

{
  ExprBase EVar1;
  Kind *pKVar2;
  UnsupportedError *this_00;
  ExprBase var;
  ExprBase coef;
  double dVar3;
  
  if (*(int *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.impl_ != 0x1c
     ) {
    BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
    ::VisitUnsupported((BasicExprVisitor<mp::(anonymous_namespace)::VariableCollector,_double,_mp::internal::ExprTypes>
                        *)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.super_ExprBase.
                          impl_,(Expr)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                      super_ExprBase.impl_);
  }
  coef.impl_ = *(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                super_ExprBase.impl_ + 8);
  EVar1.impl_ = *(Impl **)((long)e.super_BasicExpr<(mp::expr::Kind)25,_(mp::expr::Kind)38>.
                                 super_ExprBase.impl_ + 0x10);
  var.impl_ = EVar1.impl_;
  if (((EVar1.impl_)->kind_ != FIRST_REFERENCE) &&
     (pKVar2 = &(coef.impl_)->kind_, var.impl_ = coef.impl_, coef.impl_ = EVar1.impl_,
     *pKVar2 != FIRST_REFERENCE)) {
    this_00 = (UnsupportedError *)__cxa_allocate_exception(0x18);
    UnsupportedError::UnsupportedError<>(this_00,(CStringRef)0x16f842);
    __cxa_throw(this_00,&UnsupportedError::typeinfo,fmt::SystemError::~SystemError);
  }
  dVar3 = DoAddTerm(this,(Expr)coef.impl_,(Expr)var.impl_);
  return dVar3;
}

Assistant:

double BasicRandomAffineExprExtractor<Impl>::VisitBinary(BinaryExpr e) {
  switch (e.kind()) {
  case expr::MUL:
    if (e.rhs().kind() == expr::VARIABLE)
      return DoAddTerm(e.lhs(), e.rhs());
    if (e.lhs().kind() == expr::VARIABLE)
      return DoAddTerm(e.rhs(), e.lhs());
    throw UnsupportedError("nonlinear expression");
    break;
  default:
    return Base::VisitBinary(e);
  }
}